

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O0

int __thiscall Fl_Help_View::handle(Fl_Help_View *this,int event)

{
  char cVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  Fl_Help_Link *pFVar6;
  int mods;
  int yy;
  int xx;
  int event_local;
  Fl_Help_View *this_local;
  
  iVar2 = Fl::event_x();
  iVar3 = Fl_Widget::x((Fl_Widget *)this);
  iVar2 = (iVar2 - iVar3) + this->leftline_;
  iVar3 = Fl::event_y();
  iVar4 = Fl_Widget::y((Fl_Widget *)this);
  iVar3 = (iVar3 - iVar4) + this->topline_;
  switch(event) {
  case 1:
    iVar4 = Fl_Group::handle(&this->super_Fl_Group,event);
    if (iVar4 == 0) {
      handle::linkp = find_link(this,iVar2,iVar3);
      if (handle::linkp == (Fl_Help_Link *)0x0) {
        cVar1 = begin_selection(this);
        if (cVar1 == '\0') {
          fl_cursor(FL_CURSOR_DEFAULT);
          this_local._4_4_ = 1;
        }
        else {
          fl_cursor(FL_CURSOR_INSERT);
          this_local._4_4_ = 1;
        }
      }
      else {
        fl_cursor(FL_CURSOR_HAND);
        this_local._4_4_ = 1;
      }
    }
    else {
      this_local._4_4_ = 1;
    }
    break;
  case 2:
    if (handle::linkp == (Fl_Help_Link *)0x0) {
      if ((current_view == this) && (selection_push_last != 0)) {
        end_selection(this,0);
        this_local._4_4_ = 1;
      }
      else {
        this_local._4_4_ = 1;
      }
    }
    else {
      iVar2 = Fl::event_is_click();
      if (iVar2 != 0) {
        follow_link(this,handle::linkp);
      }
      fl_cursor(FL_CURSOR_DEFAULT);
      handle::linkp = (Fl_Help_Link *)0x0;
      this_local._4_4_ = 1;
    }
    break;
  case 3:
    Fl_Group::handle(&this->super_Fl_Group,event);
    this_local._4_4_ = 1;
    break;
  case 4:
    fl_cursor(FL_CURSOR_DEFAULT);
  default:
switchD_001f142b_caseD_8:
    this_local._4_4_ = Fl_Group::handle(&this->super_Fl_Group,event);
    break;
  case 5:
    if (handle::linkp == (Fl_Help_Link *)0x0) {
      if ((current_view == this) && (selection_push_last != 0)) {
        cVar1 = extend_selection(this);
        if (cVar1 != '\0') {
          Fl_Widget::redraw((Fl_Widget *)this);
        }
        fl_cursor(FL_CURSOR_INSERT);
        this_local._4_4_ = 1;
      }
      else {
        fl_cursor(FL_CURSOR_DEFAULT);
        this_local._4_4_ = 1;
      }
    }
    else {
      iVar2 = Fl::event_is_click();
      if (iVar2 == 0) {
        fl_cursor(FL_CURSOR_DEFAULT);
      }
      else {
        fl_cursor(FL_CURSOR_HAND);
      }
      this_local._4_4_ = 1;
    }
    break;
  case 6:
    Fl_Widget::redraw((Fl_Widget *)this);
    this_local._4_4_ = 1;
    break;
  case 7:
    clear_selection(this);
    Fl_Widget::redraw((Fl_Widget *)this);
    this_local._4_4_ = 1;
    break;
  case 0xb:
    pFVar6 = find_link(this,iVar2,iVar3);
    if (pFVar6 == (Fl_Help_Link *)0x0) {
      fl_cursor(FL_CURSOR_DEFAULT);
    }
    else {
      fl_cursor(FL_CURSOR_HAND);
    }
    this_local._4_4_ = 1;
    break;
  case 0xc:
    uVar5 = Fl::event_state();
    if ((uVar5 & 0x4d0000) == 0x40000) {
      iVar2 = Fl::event_key();
      if (iVar2 == 0x61) {
        select_all(this);
        Fl_Widget::redraw((Fl_Widget *)this);
        return 1;
      }
      if ((iVar2 == 99) || (iVar2 == 0x78)) {
        end_selection(this,1);
        return 1;
      }
    }
    goto switchD_001f142b_caseD_8;
  }
  return this_local._4_4_;
}

Assistant:

int				// O - 1 if we handled it, 0 otherwise
Fl_Help_View::handle(int event)	// I - Event to handle
{
  static Fl_Help_Link *linkp;   // currently clicked link

  int xx = Fl::event_x() - x() + leftline_;
  int yy = Fl::event_y() - y() + topline_;

  switch (event)
  {
    case FL_FOCUS:
      redraw();
      return 1;
    case FL_UNFOCUS:
      clear_selection();
      redraw();
      return 1;
    case FL_ENTER :
      Fl_Group::handle(event);
      return 1;
    case FL_LEAVE :
      fl_cursor(FL_CURSOR_DEFAULT);
      break;
    case FL_MOVE:
      if (find_link(xx, yy)) fl_cursor(FL_CURSOR_HAND);
      else fl_cursor(FL_CURSOR_DEFAULT);
      return 1;
    case FL_PUSH:
      if (Fl_Group::handle(event)) return 1;
      linkp = find_link(xx, yy);
      if (linkp) {
        fl_cursor(FL_CURSOR_HAND);
        return 1;
      }
      if (begin_selection()) {
        fl_cursor(FL_CURSOR_INSERT);
        return 1;
      }
      fl_cursor(FL_CURSOR_DEFAULT);
      return 1;
    case FL_DRAG:
      if (linkp) {
        if (Fl::event_is_click()) {
          fl_cursor(FL_CURSOR_HAND);
        } else {
          fl_cursor(FL_CURSOR_DEFAULT); // should be "FL_CURSOR_CANCEL" if we had it
        }
        return 1;
      }
      if (current_view==this && selection_push_last) {
        if (extend_selection()) redraw();
        fl_cursor(FL_CURSOR_INSERT);
        return 1;
      }
      fl_cursor(FL_CURSOR_DEFAULT);
      return 1;
    case FL_RELEASE:
      if (linkp) {
        if (Fl::event_is_click()) {
          follow_link(linkp);
        }
        fl_cursor(FL_CURSOR_DEFAULT);
        linkp = 0;
        return 1;
      }
      if (current_view==this && selection_push_last) {
        end_selection();
        return 1;
      }
      return 1;
    case FL_SHORTCUT: {
      int mods = Fl::event_state() & (FL_META|FL_CTRL|FL_ALT|FL_SHIFT);
      if ( mods == FL_COMMAND) {
	switch ( Fl::event_key() ) {
	  case 'a': select_all(); redraw(); return 1;
	  case 'c':
	  case 'x': end_selection(1); return 1;
	}
      }
      break; }
  }
  return (Fl_Group::handle(event));
}